

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlAutoClose(htmlParserCtxtPtr ctxt,xmlChar *newtag)

{
  int iVar1;
  bool bVar2;
  xmlChar *newtag_local;
  htmlParserCtxtPtr ctxt_local;
  
  if (((ctxt->options & 2U) == 0) && (newtag != (xmlChar *)0x0)) {
    while( true ) {
      bVar2 = false;
      if (ctxt->name != (xmlChar *)0x0) {
        iVar1 = htmlCheckAutoClose(newtag,ctxt->name);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      htmlParserFinishElementParsing(ctxt);
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->sax->endElement != (endElementSAXFunc)0x0))
      {
        (*ctxt->sax->endElement)(ctxt->userData,ctxt->name);
      }
      htmlnamePop(ctxt);
    }
  }
  return;
}

Assistant:

static void
htmlAutoClose(htmlParserCtxtPtr ctxt, const xmlChar * newtag)
{
    if (ctxt->options & HTML_PARSE_HTML5)
        return;

    if (newtag == NULL)
        return;

    while ((ctxt->name != NULL) &&
           (htmlCheckAutoClose(newtag, ctxt->name))) {
	htmlParserFinishElementParsing(ctxt);
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
}